

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  int64_t *piVar5;
  CostInterval *pCVar6;
  CostInterval *pCVar7;
  undefined1 auVar8 [16];
  int iVar9;
  CostCacheInterval *cur;
  ushort *ptr;
  uint32_t *output;
  CostManager *manager;
  VP8LHistogram *p;
  CostCacheInterval *pCVar10;
  ulong *puVar11;
  CostInterval *pCVar12;
  ushort *puVar13;
  int iVar14;
  int64_t iVar15;
  CostInterval *pCVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  CostManager *pCVar24;
  uint uVar25;
  uint64_t nmemb;
  uint uVar26;
  uint uVar27;
  uint64_t nmemb_00;
  ushort *puVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  VP8LColorCache hashers;
  VP8LRefsCursor local_90;
  ulong local_78;
  long local_70;
  VP8LBackwardRefs *local_68;
  VP8LHashChain *local_60;
  VP8LColorCache local_58;
  CostInterval *local_48;
  uint32_t *local_40;
  CostInterval *local_38;
  
  uVar27 = ysize * xsize;
  nmemb_00 = (uint64_t)(int)uVar27;
  local_60 = hash_chain;
  ptr = (ushort *)WebPSafeMalloc(nmemb_00,2);
  if (ptr == (ushort *)0x0) {
    uVar27 = 0;
    goto LAB_0014c4a6;
  }
  iVar9 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
  if (cache_bits < 1) {
    iVar9 = 0x118;
  }
  local_68 = refs_src;
  output = (uint32_t *)WebPSafeCalloc(1,(long)iVar9 * 4 + 0xca8);
  manager = (CostManager *)WebPSafeCalloc(1,0x81c8);
  bVar29 = false;
  if (manager != (CostManager *)0x0 && output != (uint32_t *)0x0) {
    *(uint32_t **)(output + 0x328) = output + 0x32a;
    if (0 < cache_bits) {
      iVar9 = VP8LColorCacheInit(&local_58,cache_bits);
      bVar29 = false;
      if (iVar9 == 0) goto LAB_0014c2ef;
    }
    VP8LRefsCursorInit(&local_90,local_68);
    p = VP8LAllocateHistogram(cache_bits);
    if (p == (VP8LHistogram *)0x0) {
      bVar29 = false;
      VP8LFreeHistogram((VP8LHistogram *)0x0);
    }
    else {
      VP8LHistogramInit(p,cache_bits,1);
      if (local_90.cur_pos != (PixOrCopy *)0x0) {
        do {
          VP8LHistogramAddSinglePixOrCopy(p,local_90.cur_pos,VP8LDistanceToPlaneCode,xsize);
          local_90.cur_pos = local_90.cur_pos + 1;
          if (local_90.cur_pos == local_90.last_pos_) {
            VP8LRefsCursorNextBlock(&local_90);
          }
        } while (local_90.cur_pos != (PixOrCopy *)0x0);
      }
      iVar9 = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
      if (p->palette_code_bits_ < 1) {
        iVar9 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar9,p->literal_,*(uint32_t **)(output + 0x328));
      ConvertPopulationCountTableToBitEstimates(0x100,p->red_,output + 0x100);
      ConvertPopulationCountTableToBitEstimates(0x100,p->blue_,output + 0x200);
      ConvertPopulationCountTableToBitEstimates(0x100,p->alpha_,output);
      local_40 = output + 0x300;
      ConvertPopulationCountTableToBitEstimates(0x28,p->distance_,local_40);
      VP8LFreeHistogram(p);
      manager->costs_ = (int64_t *)0x0;
      manager->cache_intervals_ = (CostCacheInterval *)0x0;
      manager->head_ = (CostInterval *)0x0;
      manager->recycled_intervals_ = (CostInterval *)0x0;
      manager->count_ = 0;
      manager->dist_array_ = ptr;
      local_38 = manager->intervals_;
      pCVar12 = (CostInterval *)(manager->cost_cache_ + 0xffc);
      lVar20 = 10;
      pCVar16 = (CostInterval *)0x0;
      do {
        pCVar12[1].next_ = pCVar16;
        pCVar12 = pCVar12 + 1;
        lVar20 = lVar20 + -1;
        pCVar16 = pCVar12;
      } while (lVar20 != 0);
      uVar22 = 0xfff;
      if ((int)uVar27 < 0xfff) {
        uVar22 = (ulong)uVar27;
      }
      manager->free_intervals_ = pCVar12;
      if ((int)uVar27 < 1) {
        manager->cache_intervals_size_ = 1;
LAB_0014bcb3:
        nmemb = 1;
        bVar29 = false;
      }
      else {
        lVar20 = *(long *)(output + 0x328);
        uVar21 = 0;
        do {
          if (uVar21 < 0x200) {
            uVar26 = (uint)kPrefixEncodeCode[uVar21].code_;
            uVar25 = (uint)kPrefixEncodeCode[uVar21].extra_bits_;
          }
          else {
            uVar18 = (int)uVar21 - 1;
            uVar26 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            uVar25 = 0x1e - (uVar26 ^ 0x1f);
            uVar26 = (uint)((uVar18 >> (uVar25 & 0x1f) & 1) != 0) + (uVar26 ^ 0x1f) * 2 ^ 0x3e;
          }
          manager->cost_cache_[uVar21] =
               (long)(int)uVar25 * 0x800000 +
               (ulong)*(uint *)(lVar20 + 0x400 + (long)(int)uVar26 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar22 != uVar21);
        manager->cache_intervals_size_ = 1;
        if (uVar27 == 1) goto LAB_0014bcb3;
        nmemb = 1;
        lVar20 = 0;
        iVar15 = manager->cost_cache_[0];
        do {
          lVar23 = manager->cost_cache_[lVar20 + 1];
          if (lVar23 != iVar15) {
            nmemb = nmemb + 1;
            manager->cache_intervals_size_ = nmemb;
          }
          lVar20 = lVar20 + 1;
          iVar15 = lVar23;
        } while (uVar22 - 1 != lVar20);
        bVar29 = true;
      }
      pCVar10 = (CostCacheInterval *)WebPSafeMalloc(nmemb,0x10);
      manager->cache_intervals_ = pCVar10;
      if (pCVar10 != (CostCacheInterval *)0x0) {
        pCVar10->start_ = 0;
        pCVar10->end_ = 1;
        iVar15 = manager->cost_cache_[0];
        pCVar10->cost_ = iVar15;
        if (bVar29) {
          lVar20 = 0;
          do {
            lVar23 = manager->cost_cache_[lVar20 + 1];
            if (lVar23 != iVar15) {
              pCVar10[1].start_ = (int)lVar20 + 1;
              pCVar10[1].cost_ = lVar23;
              pCVar10 = pCVar10 + 1;
            }
            pCVar10->end_ = (int)lVar20 + 2;
            lVar20 = lVar20 + 1;
            iVar15 = lVar23;
          } while (uVar22 - 1 != lVar20);
        }
        puVar11 = (ulong *)WebPSafeMalloc(nmemb_00,8);
        manager->costs_ = (int64_t *)puVar11;
        auVar8 = _DAT_001b1a60;
        if (puVar11 != (ulong *)0x0) {
          if (0 < (int)uVar27) {
            lVar20 = nmemb_00 - 1;
            auVar30._8_4_ = (int)lVar20;
            auVar30._0_8_ = lVar20;
            auVar30._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar22 = 0;
            auVar30 = auVar30 ^ _DAT_001b1a60;
            auVar31 = _DAT_001b1870;
            do {
              auVar32 = auVar31 ^ auVar8;
              if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                          auVar30._4_4_ < auVar32._4_4_) & 1)) {
                puVar11[uVar22] = 0x7fffffffffffffff;
              }
              if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
                  auVar32._12_4_ <= auVar30._12_4_) {
                puVar11[uVar22 + 1] = 0x7fffffffffffffff;
              }
              uVar22 = uVar22 + 2;
              lVar20 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 2;
              auVar31._8_8_ = lVar20 + 2;
            } while ((uVar27 + 1 & 0xfffffffe) != uVar22);
          }
          *ptr = 0;
          uVar26 = *argb;
          if (cache_bits < 1) {
LAB_0014be86:
            lVar20 = ((ulong)output[(ulong)(uVar26 & 0xff) + 0x200] +
                      (ulong)*(uint *)(*(long *)(output + 0x328) + (ulong)(uVar26 >> 8 & 0xff) * 4)
                     + (ulong)*(uint *)((long)output + (ulong)(uVar26 >> 0xe & 0x3fc) + 0x400) +
                       (ulong)output[uVar26 >> 0x18]) * 0x52;
          }
          else {
            uVar18 = uVar26 * 0x1e35a7bd >> ((byte)local_58.hash_shift_ & 0x1f);
            if (((int)uVar18 < 0) || (local_58.colors_[(int)uVar18] != uVar26)) {
              local_58.colors_[(int)uVar18] = uVar26;
              goto LAB_0014be86;
            }
            lVar20 = (ulong)*(uint *)(*(long *)(output + 0x328) + (long)(int)(uVar18 + 0x118) * 4) *
                     0x44;
          }
          uVar22 = (lVar20 + 0x32U) / 100;
          if ((long)uVar22 < (long)*puVar11) {
            *puVar11 = uVar22;
            *ptr = 1;
          }
          if (1 < (int)uVar27) {
            pCVar12 = manager->intervals_ + 9;
            local_70 = -1;
            iVar9 = -1;
            local_78 = 0;
            uVar22 = 1;
            uVar27 = 0xffffffff;
            uVar26 = 0xffffffff;
            local_48 = pCVar12;
            do {
              puVar4 = local_60->offset_length_;
              uVar18 = puVar4[uVar22];
              piVar5 = manager->costs_;
              lVar20 = piVar5[uVar22 - 1];
              uVar25 = argb[uVar22];
              if (cache_bits < 1) {
LAB_0014bfb4:
                lVar23 = ((ulong)output[(ulong)(uVar25 & 0xff) + 0x200] +
                          (ulong)*(uint *)(*(long *)(output + 0x328) +
                                          (ulong)(uVar25 >> 8 & 0xff) * 4) +
                         (ulong)*(uint *)((long)output + (ulong)(uVar25 >> 0xe & 0x3fc) + 0x400) +
                         (ulong)output[uVar25 >> 0x18]) * 0x52;
              }
              else {
                uVar19 = uVar25 * 0x1e35a7bd >> ((byte)local_58.hash_shift_ & 0x1f);
                if (((int)uVar19 < 0) || (local_58.colors_[(int)uVar19] != uVar25)) {
                  local_58.colors_[(int)uVar19] = uVar25;
                  goto LAB_0014bfb4;
                }
                lVar23 = (ulong)*(uint *)(*(long *)(output + 0x328) +
                                         (long)(int)(uVar19 + 0x118) * 4) * 0x44;
              }
              lVar23 = (lVar23 + 0x32U) / 100 + lVar20;
              if (lVar23 < piVar5[uVar22]) {
                piVar5[uVar22] = lVar23;
                ptr[uVar22] = 1;
              }
              uVar25 = uVar18 >> 0xc;
              uVar18 = uVar18 & 0xfff;
              iVar14 = (int)uVar22;
              uVar21 = local_78;
              if (1 < uVar18) {
                if (uVar25 == uVar27) {
                  uVar26 = iVar14 + -2 + uVar26;
                  if (iVar9 == 0) {
                    uVar26 = (uint)local_78;
                  }
                  iVar9 = 0;
                  uVar21 = (ulong)uVar26;
                  if ((int)uVar26 < (int)(iVar14 + uVar18 + -1)) {
                    uVar19 = 0;
                    uVar21 = uVar22 & 0xffffffff;
                    if ((long)uVar22 <= (long)(int)uVar26) {
                      uVar21 = uVar22;
                      do {
                        lVar20 = uVar21 + 1;
                        if (puVar4[lVar20] >> 0xc != uVar27) {
                          uVar19 = puVar4[uVar21 & 0xffffffff] & 0xfff;
                          goto LAB_0014c14f;
                        }
                        bVar29 = (long)uVar21 < (long)(int)uVar26;
                        uVar21 = uVar21 + 1;
                      } while (bVar29);
                      uVar19 = puVar4[lVar20] & 0xfff;
                      uVar21 = (ulong)(uVar26 + 1);
                    }
LAB_0014c14f:
                    iVar9 = (int)uVar21;
                    iVar14 = iVar9 + -1;
                    pCVar12 = manager->head_;
                    pCVar16 = pCVar12;
                    if (pCVar12 != (CostInterval *)0x0) {
                      do {
                        if (iVar9 <= pCVar16->start_) break;
                        pCVar6 = pCVar16->next_;
                        if ((iVar9 <= pCVar16->end_) && (pCVar16->cost_ < piVar5[iVar14])) {
                          iVar2 = pCVar16->index_;
                          piVar5[iVar14] = pCVar16->cost_;
                          manager->dist_array_[iVar14] = ((short)iVar14 - (short)iVar2) + 1;
                        }
                        pCVar16 = pCVar6;
                      } while (pCVar6 != (CostInterval *)0x0);
                      uVar17 = uVar21 & 0xffffffff;
                      do {
                        if (iVar9 < pCVar12->start_) break;
                        pCVar16 = pCVar12->next_;
                        if ((iVar9 < pCVar12->end_) && (pCVar12->cost_ < piVar5[uVar17])) {
                          iVar2 = pCVar12->index_;
                          piVar5[uVar17] = pCVar12->cost_;
                          manager->dist_array_[uVar17] = ((short)uVar21 - (short)iVar2) + 1;
                        }
                        pCVar12 = pCVar16;
                      } while (pCVar16 != (CostInterval *)0x0);
                    }
                    PushInterval(manager,piVar5[iVar14] + local_70,iVar9,uVar19);
                    iVar9 = 0;
                    pCVar12 = local_48;
                    uVar21 = (ulong)(iVar14 + uVar19);
                  }
                }
                else {
                  iVar9 = VP8LDistanceToPlaneCode(xsize,uVar25);
                  if (iVar9 < 0x200) {
                    uVar27 = (uint)kPrefixEncodeCode[iVar9].code_;
                    uVar19 = (uint)kPrefixEncodeCode[iVar9].extra_bits_;
                  }
                  else {
                    uVar26 = iVar9 - 1;
                    uVar27 = 0x1f;
                    if (uVar26 != 0) {
                      for (; uVar26 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                      }
                    }
                    uVar19 = 0x1e - (uVar27 ^ 0x1f);
                    uVar27 = (uint)((uVar26 >> (uVar19 & 0x1f) & 1) != 0) + (uVar27 ^ 0x1f) * 2 ^
                             0x3e;
                  }
                  local_70 = (long)(int)uVar19 * 0x800000 + (ulong)local_40[(int)uVar27];
                  PushInterval(manager,lVar20 + local_70,iVar14,uVar18);
                  iVar9 = 1;
                  uVar21 = local_78;
                }
              }
              local_78 = uVar21;
              pCVar16 = manager->head_;
              while ((pCVar6 = pCVar16, pCVar6 != (CostInterval *)0x0 &&
                     ((long)pCVar6->start_ <= (long)uVar22))) {
                pCVar16 = pCVar6->next_;
                if ((long)uVar22 < (long)pCVar6->end_) {
                  if (pCVar6->cost_ < manager->costs_[uVar22]) {
                    iVar14 = pCVar6->index_;
                    manager->costs_[uVar22] = pCVar6->cost_;
                    manager->dist_array_[uVar22] = ((short)uVar22 - (short)iVar14) + 1;
                  }
                }
                else {
                  pCVar7 = pCVar6->previous_;
                  pCVar24 = (CostManager *)&pCVar7->next_;
                  if (pCVar7 == (CostInterval *)0x0) {
                    pCVar24 = manager;
                  }
                  pCVar24->head_ = pCVar16;
                  if (pCVar16 != (CostInterval *)0x0) {
                    pCVar16->previous_ = pCVar7;
                  }
                  bVar29 = pCVar12 < pCVar6 || pCVar6 < local_38;
                  pCVar7 = (&manager->free_intervals_)[bVar29];
                  (&manager->free_intervals_)[bVar29] = pCVar6;
                  pCVar6->next_ = pCVar7;
                  manager->count_ = manager->count_ + -1;
                }
              }
              uVar22 = uVar22 + 1;
              uVar27 = uVar25;
              uVar26 = uVar18;
            } while (uVar22 != nmemb_00);
          }
          bVar29 = local_68->error_ == 0;
          goto LAB_0014c2dc;
        }
      }
      CostManagerClear(manager);
      bVar29 = false;
    }
LAB_0014c2dc:
    if (0 < cache_bits) {
      VP8LColorCacheClear(&local_58);
    }
  }
LAB_0014c2ef:
  uVar27 = 0;
  CostManagerClear(manager);
  WebPSafeFree(output);
  WebPSafeFree(manager);
  if (bVar29) {
    puVar28 = ptr + nmemb_00;
    for (puVar13 = ptr + (nmemb_00 - 1); ptr <= puVar13;
        puVar13 = (ushort *)((long)puVar13 - (ulong)((uint)uVar1 * 2))) {
      uVar1 = *puVar13;
      puVar28[-1] = uVar1;
      puVar28 = puVar28 + -1;
    }
    if ((cache_bits < 1) ||
       (iVar9 = VP8LColorCacheInit((VP8LColorCache *)&local_90,cache_bits), iVar9 != 0)) {
      VP8LClearBackwardRefs(refs_dst);
      uVar27 = (uint)((ulong)((long)(ptr + nmemb_00) - (long)puVar28) >> 1);
      if (0 < (int)uVar27) {
        uVar22 = 0;
        uVar26 = 0;
        do {
          uVar1 = puVar28[uVar22];
          if (uVar1 == 1) {
            if (cache_bits < 1) {
LAB_0014c3de:
              uVar18 = argb[uVar26];
              uVar21 = 0x10000;
            }
            else {
              uVar3 = argb[uVar26];
              uVar18 = uVar3 * 0x1e35a7bd >> ((byte)local_90.cur_block_ & 0x1f);
              uVar21 = 0x10001;
              if (*(uint32_t *)(&(local_90.cur_pos)->mode + (long)(int)uVar18 * 4) != uVar3 ||
                  (int)uVar18 < 0) {
                *(uint32_t *)(&(local_90.cur_pos)->mode + (long)(int)uVar18 * 4) = uVar3;
                goto LAB_0014c3de;
              }
            }
            VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar18 << 0x20 | uVar21));
          }
          else {
            VP8LBackwardRefsCursorAdd
                      (refs_dst,(PixOrCopy)
                                ((ulong)CONCAT42(local_60->offset_length_[uVar26] >> 0xc,uVar1) *
                                 0x10000 + 2));
            if ((0 < cache_bits) && (uVar1 != 0)) {
              uVar21 = 0;
              do {
                *(uint32_t *)
                 (&(local_90.cur_pos)->mode +
                 (long)(int)(argb[uVar26 + uVar21] * 0x1e35a7bd >>
                            ((byte)local_90.cur_block_ & 0x1f)) * 4) = argb[uVar26 + uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar1 != uVar21);
            }
          }
          uVar26 = uVar26 + uVar1;
          uVar22 = uVar22 + 1;
        } while (uVar22 != (uVar27 & 0x7fffffff));
      }
      bVar29 = refs_dst->error_ == 0;
      if (0 < cache_bits) {
        VP8LColorCacheClear((VP8LColorCache *)&local_90);
      }
    }
    else {
      bVar29 = false;
    }
    uVar27 = (uint)bVar29;
  }
LAB_0014c4a6:
  WebPSafeFree(ptr);
  return uVar27;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}